

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HBDEstimateNoiseTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HBDEstimateNoiseTest_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_int,_int,_int>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x48);
  anon_unknown.dwarf_615ea6::HBDEstimateNoiseTest_DISABLED_Speed_Test::
  HBDEstimateNoiseTest_DISABLED_Speed_Test((HBDEstimateNoiseTest_DISABLED_Speed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }